

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O3

SumNum __thiscall
Instance::sumnumprimalinfeasibilities(Instance *this,QpVector *x,QpVector *rowactivity)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  SumNum SVar6;
  
  if ((long)this->num_con < 1) {
    uVar2 = 0;
    dVar4 = 0.0;
  }
  else {
    lVar3 = 0;
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      dVar1 = (rowactivity->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      dVar5 = (this->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if (dVar5 <= dVar1) {
        dVar5 = (this->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (dVar5 < dVar1) {
          dVar5 = dVar1 - dVar5;
          goto LAB_003367cc;
        }
      }
      else {
        dVar5 = dVar5 - dVar1;
LAB_003367cc:
        dVar4 = dVar4 + dVar5;
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      lVar3 = lVar3 + 1;
    } while (this->num_con != lVar3);
  }
  if (0 < (long)this->num_var) {
    lVar3 = 0;
    do {
      dVar1 = (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      dVar5 = (this->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if (dVar5 <= dVar1) {
        dVar5 = (this->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (dVar5 < dVar1) {
          dVar5 = dVar1 - dVar5;
          goto LAB_0033682c;
        }
      }
      else {
        dVar5 = dVar5 - dVar1;
LAB_0033682c:
        dVar4 = dVar4 + dVar5;
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      lVar3 = lVar3 + 1;
    } while (this->num_var != lVar3);
  }
  SVar6._8_8_ = uVar2;
  SVar6.sum = dVar4;
  return SVar6;
}

Assistant:

SumNum sumnumprimalinfeasibilities(const QpVector& x,
                                     const QpVector& rowactivity) {
    SumNum res;
    for (HighsInt row = 0; row < num_con; row++) {
      if (rowactivity.value[row] < con_lo[row]) {
        res.sum += (con_lo[row] - rowactivity.value[row]);
        res.num++;
      } else if (rowactivity.value[row] > con_up[row]) {
        res.sum += (rowactivity.value[row] - con_up[row]);
        res.num++;
      }
    }
    for (HighsInt var = 0; var < num_var; var++) {
      if (x.value[var] < var_lo[var]) {
        res.sum += (var_lo[var] - x.value[var]);
        res.num++;
      } else if (x.value[var] > var_up[var]) {
        res.sum += (x.value[var] - var_up[var]);
        res.num++;
      }
    }
    return res;
  }